

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O0

int Mpm_ManNodeIfToGia(Gia_Man_t *pNew,Mpm_Man_t *pMan,Mig_Obj_t *pObj,Vec_Int_t *vLeaves,int fHash)

{
  Mig_Man_t *pMVar1;
  int iVar2;
  Mpm_Cut_t *pMVar3;
  Mpm_Cut_t *pMVar4;
  bool bVar5;
  int local_4c;
  int iRes;
  int i;
  Mig_Obj_t *pFanin;
  Mpm_Cut_t *pCut;
  int fHash_local;
  Vec_Int_t *vLeaves_local;
  Mig_Obj_t *pObj_local;
  Mpm_Man_t *pMan_local;
  Gia_Man_t *pNew_local;
  
  pMVar3 = Mpm_ObjCutBestP(pMan,pObj);
  if (1 < *(uint *)&pMVar3->field_0x4 >> 0x1b) {
    local_4c = 0;
    while( true ) {
      bVar5 = false;
      if (local_4c < (int)(*(uint *)&pMVar3->field_0x4 >> 0x1b)) {
        pMVar1 = pMan->pMig;
        iVar2 = Abc_Lit2Var(pMVar3->pLeaves[local_4c]);
        _iRes = Mig_ManObj(pMVar1,iVar2);
        bVar5 = _iRes != (Mig_Obj_t *)0x0;
      }
      if (!bVar5) break;
      pMVar4 = Mpm_ObjCutBestP(pMan,_iRes);
      iVar2 = Vec_IntEntry(vLeaves,local_4c);
      Mpm_CutSetDataInt(pMVar4,iVar2);
      local_4c = local_4c + 1;
    }
    Vec_PtrClear(pMan->vTemp);
    pNew_local._4_4_ = Mpm_ManNodeIfToGia_rec(pNew,pMan,pObj,pMan->vTemp,fHash);
    if (pNew_local._4_4_ == -1) {
      Abc_Print(-1,"Mpm_ManNodeIfToGia(): Computing local AIG has failed.\n");
      pNew_local._4_4_ = -1;
    }
    else {
      local_4c = 0;
      while( true ) {
        bVar5 = false;
        if (local_4c < (int)(*(uint *)&pMVar3->field_0x4 >> 0x1b)) {
          pMVar1 = pMan->pMig;
          iVar2 = Abc_Lit2Var(pMVar3->pLeaves[local_4c]);
          _iRes = Mig_ManObj(pMVar1,iVar2);
          bVar5 = _iRes != (Mig_Obj_t *)0x0;
        }
        if (!bVar5) break;
        pMVar4 = Mpm_ObjCutBestP(pMan,_iRes);
        Mpm_CutSetDataInt(pMVar4,0);
        local_4c = local_4c + 1;
      }
      for (local_4c = 0; iVar2 = Vec_PtrSize(pMan->vTemp), local_4c < iVar2; local_4c = local_4c + 1
          ) {
        pMVar3 = (Mpm_Cut_t *)Vec_PtrEntry(pMan->vTemp,local_4c);
        Mpm_CutSetDataInt(pMVar3,0);
      }
    }
    return pNew_local._4_4_;
  }
  __assert_fail("pCut->nLeaves > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmAbc.c"
                ,0xc2,
                "int Mpm_ManNodeIfToGia(Gia_Man_t *, Mpm_Man_t *, Mig_Obj_t *, Vec_Int_t *, int)");
}

Assistant:

int Mpm_ManNodeIfToGia( Gia_Man_t * pNew, Mpm_Man_t * pMan, Mig_Obj_t * pObj, Vec_Int_t * vLeaves, int fHash )
{
    Mpm_Cut_t * pCut;
    Mig_Obj_t * pFanin;
    int i, iRes;
    // get the best cut
    pCut = Mpm_ObjCutBestP( pMan, pObj );
    assert( pCut->nLeaves > 1 );
    // set the leaf variables
    Mpm_CutForEachLeaf( pMan->pMig, pCut, pFanin, i )
        Mpm_CutSetDataInt( Mpm_ObjCutBestP(pMan, pFanin), Vec_IntEntry(vLeaves, i) );
    // recursively compute the function while collecting visited cuts
    Vec_PtrClear( pMan->vTemp );
    iRes = Mpm_ManNodeIfToGia_rec( pNew, pMan, pObj, pMan->vTemp, fHash ); 
    if ( iRes == ~0 )
    {
        Abc_Print( -1, "Mpm_ManNodeIfToGia(): Computing local AIG has failed.\n" );
        return ~0;
    }
    // clean the cuts
    Mpm_CutForEachLeaf( pMan->pMig, pCut, pFanin, i )
        Mpm_CutSetDataInt( Mpm_ObjCutBestP(pMan, pFanin), 0 );
    Vec_PtrForEachEntry( Mpm_Cut_t *, pMan->vTemp, pCut, i )
        Mpm_CutSetDataInt( pCut, 0 );
    return iRes;
}